

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O0

int ConvertStringToInt32(TCHAR *szString,size_t nMaxDigits,PDWORD PtrValue)

{
  byte local_32;
  byte local_31;
  BYTE DigitTwo;
  ulong uStack_30;
  BYTE DigitOne;
  size_t i;
  PDWORD PtrValue_local;
  size_t nMaxDigits_local;
  TCHAR *szString_local;
  
  if ((nMaxDigits & 1) != 0) {
    __assert_fail("(nMaxDigits & 0x01) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/Common.cpp"
                  ,0x1ef,"int ConvertStringToInt32(const TCHAR *, size_t, PDWORD)");
  }
  if (nMaxDigits < 9) {
    *PtrValue = 0;
    uStack_30 = 0;
    nMaxDigits_local = (size_t)szString;
    while( true ) {
      if (nMaxDigits >> 1 <= uStack_30) {
        return 0;
      }
      local_31 = AsciiToUpperTable_BkSlash[*(char *)nMaxDigits_local] - 0x30;
      if (9 < local_31) {
        local_31 = AsciiToUpperTable_BkSlash[*(char *)nMaxDigits_local] - 0x37;
      }
      local_32 = AsciiToUpperTable_BkSlash[*(char *)(nMaxDigits_local + 1)] - 0x30;
      if (9 < local_32) {
        local_32 = AsciiToUpperTable_BkSlash[*(char *)(nMaxDigits_local + 1)] - 0x37;
      }
      if ((0xf < local_31) || (0xf < local_32)) break;
      *PtrValue = *PtrValue << 8 | (uint)local_31 << 4 | (uint)local_32;
      nMaxDigits_local = nMaxDigits_local + 2;
      uStack_30 = uStack_30 + 1;
    }
    return 1000;
  }
  __assert_fail("nMaxDigits <= 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/Common.cpp"
                ,0x1f0,"int ConvertStringToInt32(const TCHAR *, size_t, PDWORD)");
}

Assistant:

int ConvertStringToInt32(const TCHAR * szString, size_t nMaxDigits, PDWORD PtrValue)
{
    // The number of digits must be even
    assert((nMaxDigits & 0x01) == 0);
    assert(nMaxDigits <= 8);

    // Prepare the variables
    PtrValue[0] = 0;
    nMaxDigits >>= 1;

    // Convert the string up to the number of digits
    for(size_t i = 0; i < nMaxDigits; i++)
    {
        BYTE DigitOne;
        BYTE DigitTwo;

        DigitOne = (BYTE)(AsciiToUpperTable_BkSlash[szString[0]] - _T('0'));
        if(DigitOne > 9)
            DigitOne -= 'A' - '9' - 1;

        DigitTwo = (BYTE)(AsciiToUpperTable_BkSlash[szString[1]] - _T('0'));
        if(DigitTwo > 9)
            DigitTwo -= 'A' - '9' - 1;

        if(DigitOne > 0x0F || DigitTwo > 0x0F)
            return ERROR_BAD_FORMAT;

        PtrValue[0] = (PtrValue[0] << 0x08) | (DigitOne << 0x04) | DigitTwo;
        szString += 2;
    }

    return ERROR_SUCCESS;
}